

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O1

void __thiscall
fill<128U,_28U,_buffer_layout_bfs>::operator()
          (fill<128U,_28U,_buffer_layout_bfs> *this,array<Stream,_128UL> *streams,uchar **buffer,
          array<unsigned_long,_128UL> *buffer_count)

{
  unsigned_long uVar1;
  uchar *__s1;
  unsigned_long uVar2;
  uchar *__s2;
  array<unsigned_long,_128UL> *buffer_count_00;
  int iVar3;
  size_t sVar4;
  unsigned_long *puVar5;
  long lVar6;
  size_t __n;
  unsigned_long *puVar7;
  uchar **from0;
  fill<128U,_56U,_buffer_layout_bfs> local_6c;
  fill<128U,_57U,_buffer_layout_bfs> local_6b;
  fill<128U,_57U,_buffer_layout_bfs> local_6a;
  fill<128U,_56U,_buffer_layout_bfs> local_69;
  uchar **local_68;
  array<Stream,_128UL> *local_60;
  unsigned_long *local_58;
  array<unsigned_long,_128UL> *local_50;
  unsigned_long *local_48;
  size_t local_40;
  long local_38;
  
  puVar7 = buffer_count->_M_elems + 0x38;
  local_48 = buffer_count->_M_elems + 0x39;
  local_68 = buffer + 0x45fc;
  sVar4 = 0;
  lVar6 = 0;
  local_60 = streams;
  local_58 = puVar7;
  local_50 = buffer_count;
  while ((buffer_count_00 = local_50, *puVar7 != 0 ||
         (fill<128U,_56U,_buffer_layout_bfs>::operator()(&local_69,local_60,buffer,local_50),
         buffer_count_00->_M_elems[0x38] != 0))) {
    puVar5 = local_48;
    if ((*local_48 == 0) &&
       (fill<128U,_57U,_buffer_layout_bfs>::operator()(&local_6a,local_60,buffer,buffer_count_00),
       buffer_count_00->_M_elems[0x39] == 0)) {
      __n = -lVar6;
      lVar6 = -sVar4;
      goto LAB_00155603;
    }
    uVar1 = *puVar7;
    __s1 = buffer[0x5d68 - uVar1];
    local_40 = sVar4;
    local_38 = lVar6;
    if (__s1 == (uchar *)0x0) {
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
    }
    uVar2 = *puVar5;
    __s2 = buffer[0x5d70 - uVar2];
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar3 = strcmp((char *)__s1,(char *)__s2);
    sVar4 = local_40;
    puVar7 = local_58;
    if (iVar3 < 1) {
      puVar5 = local_58;
      __s2 = __s1;
      uVar2 = uVar1;
    }
    buffer[local_40 + 0x45fc] = __s2;
    *puVar5 = uVar2 - 1;
    check_input(local_68,local_40);
    lVar6 = local_38 + -8;
    sVar4 = sVar4 + 1;
    if (sVar4 == 0x5a9) {
      local_50->_M_elems[0x1c] = 0x5a9;
      return;
    }
  }
  __n = -lVar6;
  lVar6 = -sVar4;
  do {
    if ((buffer_count_00->_M_elems[0x39] == 0) &&
       (fill<128U,_57U,_buffer_layout_bfs>::operator()(&local_6b,local_60,buffer,buffer_count_00),
       buffer_count_00->_M_elems[0x39] == 0)) goto LAB_0015566e;
    uVar1 = buffer_count_00->_M_elems[0x39];
    *(uchar **)((long)buffer + __n + 0x22fe0) = buffer[0x5d70 - uVar1];
    buffer_count_00->_M_elems[0x39] = uVar1 - 1;
    lVar6 = lVar6 + -1;
    __n = __n + 8;
  } while (__n != 0x2d48);
  goto LAB_00155657;
LAB_0015566e:
  from0 = (uchar **)((long)buffer + (0x25d28 - __n));
  sVar4 = -lVar6;
  memmove(buffer + lVar6 + 0x4ba5,local_68,__n);
  buffer_count_00->_M_elems[0x1c] = sVar4;
  goto LAB_001556a0;
  while( true ) {
    uVar1 = *puVar7;
    *(uchar **)((long)buffer + __n + 0x22fe0) = buffer[0x5d68 - uVar1];
    *puVar7 = uVar1 - 1;
    lVar6 = lVar6 + -1;
    __n = __n + 8;
    if (__n == 0x2d48) break;
LAB_00155603:
    if ((*puVar7 == 0) &&
       (fill<128U,_56U,_buffer_layout_bfs>::operator()(&local_6c,local_60,buffer,buffer_count_00),
       buffer_count_00->_M_elems[0x38] == 0)) goto LAB_0015566e;
  }
LAB_00155657:
  buffer_count_00->_M_elems[0x1c] = 0x5a9;
  sVar4 = 0x5a9;
  from0 = local_68;
LAB_001556a0:
  check_input(from0,sVar4);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}